

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdnewpfor.h
# Opt level: O0

void __thiscall
FastPForLib::SIMDNewPFor<4U,_FastPForLib::Simple16<false>_>::encodeBlock
          (SIMDNewPFor<4U,_FastPForLib::Simple16<false>_> *this,uint32_t *in,uint32_t *out,
          size_t *nvalue)

{
  value_type vVar1;
  value_type vVar2;
  uint uVar3;
  uint uVar4;
  reference pvVar5;
  byte bVar6;
  long *in_RCX;
  uint *in_RDX;
  long in_RSI;
  uint32_t *in_RDI;
  uint32_t i_3;
  uint32_t i_2;
  uint32_t prev;
  uint32_t cur;
  uint32_t i_1;
  uint32_t i;
  uint32_t *initout;
  size_t encodedExceptions_sz;
  uint32_t nExceptions;
  uint32_t b;
  uint32_t len;
  size_t *in_stack_00000150;
  uint32_t *in_stack_00000158;
  size_t in_stack_00000160;
  uint32_t *in_stack_00000168;
  Simple16<false> *in_stack_00000170;
  value_type local_78;
  uint in_stack_ffffffffffffff94;
  uint in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  uint local_58;
  uint local_54;
  uint local_48;
  uint local_44;
  uint local_2c;
  
  uVar4 = (**(code **)(*(long *)in_RDI + 0x48))(in_RDI,in_RSI,0x80);
  if (uVar4 < 0x20) {
    local_2c = 0;
    for (local_44 = 0; local_44 < 0x80; local_44 = local_44 + 1) {
      bVar6 = (byte)uVar4;
      if (*(uint *)(in_RSI + (ulong)local_44 * 4) < (uint)(1 << (bVar6 & 0x1f))) {
        vVar1 = *(value_type *)(in_RSI + (ulong)local_44 * 4);
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x16),
                            (ulong)local_44);
        *pvVar5 = vVar1;
      }
      else {
        in_stack_ffffffffffffff94 =
             *(uint *)(in_RSI + (ulong)local_44 * 4) & (1 << (bVar6 & 0x1f)) - 1U;
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x16),
                            (ulong)local_44);
        *pvVar5 = in_stack_ffffffffffffff94;
        in_stack_ffffffffffffff98 = local_44;
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 4),
                            (ulong)local_2c);
        *pvVar5 = in_stack_ffffffffffffff98;
        in_stack_ffffffffffffff9c = *(uint *)(in_RSI + (ulong)local_44 * 4) >> (bVar6 & 0x1f);
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 10),
                            (ulong)local_2c);
        *pvVar5 = in_stack_ffffffffffffff9c;
        local_2c = local_2c + 1;
      }
    }
    uVar3 = local_2c;
    if (local_2c != 0) {
      while (local_48 = uVar3 - 1, local_48 != 0) {
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 4),
                            (ulong)local_48);
        vVar1 = *pvVar5;
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 4),
                            (ulong)(uVar3 - 2));
        vVar2 = *pvVar5;
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 4),
                            (ulong)local_48);
        *pvVar5 = vVar1 - vVar2;
        uVar3 = local_48;
      }
      for (local_54 = 0; local_54 < local_2c; local_54 = local_54 + 1) {
        if (local_54 == 0) {
          pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 4),0)
          ;
          local_78 = *pvVar5;
        }
        else {
          pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 4),
                              (ulong)local_54);
          local_78 = *pvVar5 - 1;
        }
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x10),
                            (ulong)local_54);
        *pvVar5 = local_78;
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 10),
                            (ulong)local_54);
        vVar1 = *pvVar5;
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x10),
                            (ulong)(local_54 + local_2c));
        *pvVar5 = vVar1 - 1;
      }
    }
    if (local_2c != 0) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x10),0);
      Simple16<false>::encodeArray
                (in_stack_00000170,in_stack_00000168,in_stack_00000160,in_stack_00000158,
                 in_stack_00000150);
    }
    *in_RDX = uVar4 << 0x1a | local_2c << 0x10;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x16),0);
    usimdpack(in_RDI,(__m128i *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
              in_stack_ffffffffffffff94);
    *in_RCX = (long)((ulong)(uVar4 << 2) * 4 + 4) >> 2;
  }
  else {
    *in_RDX = uVar4 << 0x1a;
    for (local_58 = 0; local_58 < 0x80; local_58 = local_58 + 1) {
      in_RDX[(ulong)local_58 + 1] = *(uint *)(in_RSI + (ulong)local_58 * 4);
    }
    *in_RCX = 0x81;
  }
  return;
}

Assistant:

void SIMDNewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::encodeBlock(
    const uint32_t *in, uint32_t *out, size_t &nvalue) {
  const uint32_t len = BlockSize;

  uint32_t b = findBestB(in, len);
  if (b < 32) {

    uint32_t nExceptions = 0;
    size_t encodedExceptions_sz = 0;

    const uint32_t *const initout(out);
    for (uint32_t i = 0; i < len; i++) {

      if (in[i] >= (1U << b)) {
        tobecoded[i] = in[i] & ((1U << b) - 1);
        exceptionsPositions[nExceptions] = i;
        exceptionsValues[nExceptions] = (in[i] >> b);
        nExceptions++;
      } else {
        tobecoded[i] = in[i];
      }
    }

    if (nExceptions > 0) {

      for (uint32_t i = nExceptions - 1; i > 0; i--) {
        const uint32_t cur = exceptionsPositions[i];
        const uint32_t prev = exceptionsPositions[i - 1];

        exceptionsPositions[i] = cur - prev;
      }

      for (uint32_t i = 0; i < nExceptions; i++) {

        exceptions[i] =
            (i > 0) ? exceptionsPositions[i] - 1 : exceptionsPositions[i];
        exceptions[i + nExceptions] = exceptionsValues[i] - 1;
      }
    }

    if (nExceptions > 0)
      ecoder.encodeArray(&exceptions[0], 2 * nExceptions, out + 1,
                         encodedExceptions_sz);
    *out++ = (b << (PFORDELTA_NEXCEPT + PFORDELTA_EXCEPTSZ)) |
             (nExceptions << PFORDELTA_EXCEPTSZ) |
             static_cast<uint32_t>(encodedExceptions_sz);
    /* Write exceptional values */

    out += static_cast<uint32_t>(encodedExceptions_sz);
    assert(BlockSize == 128);
    usimdpack(&tobecoded[0], reinterpret_cast<__m128i *>(out), b);
    out += 4 * b;

    nvalue = out - initout;

  } else {
    *out++ = (b << (PFORDELTA_NEXCEPT + PFORDELTA_EXCEPTSZ));
    for (uint32_t i = 0; i < len; i++)
      out[i] = in[i];
    nvalue = len + 1;
  }
}